

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::SwitchRepresentations
          (CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  ulong uVar7;
  Char aCStack_38 [4];
  Char existCs [4];
  size_t sVar6;
  
  sVar6 = (this->rep).compact.countPlusOne;
  if (4 < sVar6 - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x35f,"(IsCompact())","IsCompact()");
    if (!bVar2) {
LAB_00e5b19f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    sVar6 = (this->rep).compact.countPlusOne;
    if (4 < sVar6 - 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar2) goto LAB_00e5b19f;
      *puVar4 = 0;
      sVar6 = (this->rep).compact.countPlusOne;
    }
  }
  uVar5 = (int)sVar6 - 1;
  if (uVar5 < 5) {
    if (uVar5 == 0) {
      *(undefined8 *)((long)&this->rep + 0x10) = 0;
      *(undefined8 *)((long)&this->rep + 0x18) = 0;
      (this->rep).compact.countPlusOne = 0;
      *(undefined8 *)((long)&this->rep + 8) = 0;
      *(undefined8 *)((long)&this->rep + 0x20) = 0;
    }
    else {
      uVar7 = 0;
      do {
        uVar3 = GetCompactCharU(this,(uint)uVar7);
        aCStack_38[uVar7] = (Char)uVar3;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      *(undefined8 *)((long)&this->rep + 0x10) = 0;
      *(undefined8 *)((long)&this->rep + 0x18) = 0;
      (this->rep).compact.countPlusOne = 0;
      *(undefined8 *)((long)&this->rep + 8) = 0;
      *(undefined8 *)((long)&this->rep + 0x20) = 0;
      if (uVar5 != 0) {
        uVar7 = 0;
        do {
          SetRange(this,allocator,aCStack_38[uVar7],aCStack_38[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
    }
  }
  return;
}

Assistant:

void CharSet<char16>::SwitchRepresentations(ArenaAllocator* allocator)
    {
        Assert(IsCompact());
        uint existCount = this->GetCompactLength();
        __assume(existCount <= MaxCompact);
        if (existCount <= MaxCompact)
        {
            Char existCs[MaxCompact];
            for (uint i = 0; i < existCount; i++)
            {
                existCs[i] = GetCompactChar(i);
            }
            rep.full.root = nullptr;
            rep.full.direct.Clear();
            for (uint i = 0; i < existCount; i++)
                Set(allocator, existCs[i]);
        }
    }